

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowFittingType::~IfcFlowFittingType(IfcFlowFittingType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = 0x883c00;
  *(undefined8 *)&(this->super_IfcDistributionFlowElementType).field_0x1b0 = 0x883cc8;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = 0x883c28;
  (this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
  .super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x883c50;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = 0x883c78;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.field_0x148 = 0x883ca0;
  puVar1 = *(undefined1 **)
            &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.field_0x158;
  if (puVar1 != &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
                 super_IfcElementType.field_0x168) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__008837d0);
  operator_delete(this);
  return;
}

Assistant:

IfcFlowFittingType() : Object("IfcFlowFittingType") {}